

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O1

void google::CaptureTestOutput(int fd,string *filename)

{
  pointer pcVar1;
  CapturedStream *pCVar2;
  CapturedStream *pCVar3;
  ostream *poVar4;
  pointer *__ptr;
  default_delete<google::CapturedStream> *this;
  CapturedStream *local_98;
  LogMessage local_90;
  
  if (fd - 3U < 0xfffffffe) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15b);
    poVar4 = LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Check failed: (fd == STDOUT_FILENO) || (fd == STDERR_FILENO) ",0x3d);
  }
  else {
    if (*(long *)(s_captured_streams + (ulong)(uint)fd * 8) == 0) {
      pCVar3 = (CapturedStream *)operator_new(0x28);
      pcVar1 = (filename->_M_dataplus)._M_p;
      local_90.allocated_ = (LogMessageData *)&local_90.time_;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + filename->_M_string_length);
      CapturedStream::CapturedStream(pCVar3,fd,(string *)&local_90);
      this = (default_delete<google::CapturedStream> *)(s_captured_streams + (ulong)(uint)fd * 8);
      local_98 = pCVar3;
      if (local_90.allocated_ != (LogMessageData *)&local_90.time_) {
        free(local_90.allocated_);
      }
      pCVar2 = local_98;
      local_98 = (CapturedStream *)0x0;
      pCVar3 = *(CapturedStream **)this;
      *(CapturedStream **)this = pCVar2;
      if (pCVar3 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()(this,pCVar3);
      }
      if (local_98 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()
                  ((default_delete<google::CapturedStream> *)&local_98,local_98);
      }
      return;
    }
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar4 = LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Check failed: s_captured_streams[fd] == nullptr ",0x30);
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

static inline void CaptureTestOutput(int fd, const string& filename) {
  CHECK((fd == STDOUT_FILENO) || (fd == STDERR_FILENO));
  CHECK(s_captured_streams[fd] == nullptr);
  s_captured_streams[fd] = std::make_unique<CapturedStream>(fd, filename);
}